

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_max_data_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  st_quicly_conn_t *in_RDI;
  quicly_conn_t *_conn;
  int ret;
  quicly_max_data_frame_t frame;
  quicly_max_data_frame_t *in_stack_ffffffffffffffc8;
  uint8_t *in_stack_ffffffffffffffd0;
  st_quicly_conn_t *arg0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  st_quicly_conn_t *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = quicly_decode_max_data_frame
                      ((uint8_t **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    arg0 = in_RDI;
    if ((quicly_trace_fp != (FILE *)0x0) &&
       (iVar1 = ptls_skip_tracing((in_RDI->crypto).tls), iVar1 == 0)) {
      QUICLY_MAX_DATA_RECEIVE
                (in_stack_ffffffffffffffe0,CONCAT44(local_4,in_stack_ffffffffffffffd8),
                 (uint64_t)arg0);
    }
    QUICLY_TRACER_MAX_DATA_RECEIVE(arg0,(int64_t)in_stack_ffffffffffffffc8,0x14de13);
    if ((st_quicly_conn_t *)(in_RDI->egress).max_data.permitted < in_stack_ffffffffffffffe0) {
      (in_RDI->egress).max_data.permitted = (uint64_t)in_stack_ffffffffffffffe0;
      (in_RDI->egress).data_blocked = QUICLY_SENDER_STATE_UNACKED;
      local_4 = 0;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int handle_max_data_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_max_data_frame_t frame;
    int ret;

    if ((ret = quicly_decode_max_data_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(MAX_DATA_RECEIVE, conn, conn->stash.now, frame.max_data);

    if (frame.max_data <= conn->egress.max_data.permitted)
        return 0;
    conn->egress.max_data.permitted = frame.max_data;
    conn->egress.data_blocked = QUICLY_SENDER_STATE_UNACKED; /* DATA_BLOCKED has not been sent for the new limit */

    return 0;
}